

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

IVal * deqp::gls::BuiltinPrecisionTests::
       ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doUnion
                 (IVal *a,IVal *b)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 uVar5;
  IVal *ret;
  IVal *in_RDI;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  
  lVar6 = 0x10;
  do {
    *(undefined1 *)((long)in_RDI->m_data + lVar6 + -0x10) = 0;
    *(undefined8 *)((long)in_RDI->m_data + lVar6 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(&in_RDI->m_data[0].m_hasNaN + lVar6) = 0xfff0000000000000;
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x70);
  lVar6 = 0x10;
  do {
    *(undefined1 *)((long)in_RDI->m_data + lVar6 + -0x10) = 0;
    *(undefined8 *)((long)in_RDI->m_data + lVar6 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(&in_RDI->m_data[0].m_hasNaN + lVar6) = 0xfff0000000000000;
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x70);
  lVar6 = 0x10;
  do {
    uVar5 = 1;
    if (*(char *)((long)a->m_data + lVar6 + -0x10) == '\0') {
      uVar5 = (undefined1)*(undefined4 *)((long)b->m_data + lVar6 + -0x10);
    }
    dVar1 = *(double *)((long)a->m_data + lVar6 + -8);
    dVar2 = *(double *)(&a->m_data[0].m_hasNaN + lVar6);
    dVar3 = *(double *)((long)b->m_data + lVar6 + -8);
    dVar4 = *(double *)(&b->m_data[0].m_hasNaN + lVar6);
    uVar7 = -(ulong)(dVar1 <= dVar3);
    uVar8 = -(ulong)(dVar4 <= dVar2);
    *(undefined1 *)((long)in_RDI->m_data + lVar6 + -0x10) = uVar5;
    *(ulong *)((long)in_RDI->m_data + lVar6 + -8) = ~uVar7 & (ulong)dVar3 | (ulong)dVar1 & uVar7;
    *(ulong *)(&in_RDI->m_data[0].m_hasNaN + lVar6) = ~uVar8 & (ulong)dVar4 | (ulong)dVar2 & uVar8;
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x70);
  return in_RDI;
}

Assistant:

static IVal			doUnion			(const IVal& a, const IVal& b)
	{
		IVal ret;

		for (int ndx = 0; ndx < T::SIZE; ++ndx)
			ret[ndx] = unionIVal<Element>(a[ndx], b[ndx]);

		return ret;
	}